

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderGrid.cpp
# Opt level: O1

void __thiscall OrderGrid::setColors(OrderGrid *this,Palette *colors)

{
  undefined8 uVar1;
  uint uVar2;
  QPalette *pQVar3;
  QColor *pQVar4;
  QPalette pal;
  QBrush local_30 [8];
  QPalette local_28 [16];
  
  pQVar3 = (QPalette *)QWidget::palette();
  QPalette::QPalette(local_28,pQVar3);
  uVar2 = QWidget::backgroundRole();
  pQVar4 = Palette::operator[](colors,ColorBackground);
  QBrush::QBrush(local_30,pQVar4,SolidPattern);
  QPalette::setBrush((ColorGroup)local_28,Mid,(QBrush *)(ulong)uVar2);
  QBrush::~QBrush(local_30);
  QWidget::setPalette((QPalette *)this);
  pQVar4 = Palette::operator[](colors,ColorLine);
  uVar1 = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this->mLineColor).ct + 2) = *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this->mLineColor = uVar1;
  pQVar4 = Palette::operator[](colors,ColorForeground);
  uVar1 = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this->mRownoColor).ct + 2) = *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this->mRownoColor = uVar1;
  pQVar4 = Palette::operator[](colors,ColorForegroundHighlight1);
  uVar1 = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this->mTextColor).ct + 2) = *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this->mTextColor = uVar1;
  pQVar4 = Palette::operator[](colors,ColorRow);
  uVar1 = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this->mRowColor).ct + 2) = *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this->mRowColor = uVar1;
  pQVar4 = Palette::operator[](colors,ColorRowPlayer);
  uVar1 = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this->mTrackerColor).ct + 2) = *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this->mTrackerColor = uVar1;
  pQVar4 = Palette::operator[](colors,ColorCursor);
  uVar1 = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this->mCursorColor).ct + 2) = *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this->mCursorColor = uVar1;
  QColor::setAlpha((int)this + 0xa0);
  QWidget::update();
  QPalette::~QPalette(local_28);
  return;
}

Assistant:

void OrderGrid::setColors(Palette const& colors) {
    auto pal = palette();
    pal.setColor(backgroundRole(), colors[Palette::ColorBackground]);
    setPalette(pal);

    mLineColor = colors[Palette::ColorLine];
    mRownoColor = colors[Palette::ColorForeground];
    mTextColor = colors[Palette::ColorForegroundHighlight1];
    mRowColor = colors[Palette::ColorRow];
    mTrackerColor = colors[Palette::ColorRowPlayer];
    mCursorColor = colors[Palette::ColorCursor];
    mCursorColor.setAlpha(128);

    update();
}